

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O0

Gia_MmFlex_t * Gia_MmFlexStart(void)

{
  Gia_MmFlex_t *__s;
  char **ppcVar1;
  Gia_MmFlex_t *p;
  
  __s = (Gia_MmFlex_t *)malloc(0x38);
  memset(__s,0,0x38);
  __s->nEntriesUsed = 0;
  __s->pCurrent = (char *)0x0;
  __s->pEnd = (char *)0x0;
  __s->nChunkSize = 0x40000;
  __s->nChunksAlloc = 0x40;
  __s->nChunks = 0;
  ppcVar1 = (char **)malloc((long)__s->nChunksAlloc << 3);
  __s->pChunks = ppcVar1;
  __s->nMemoryUsed = 0;
  __s->nMemoryAlloc = 0;
  return __s;
}

Assistant:

Gia_MmFlex_t * Gia_MmFlexStart()
{
    Gia_MmFlex_t * p;

    p = ABC_ALLOC( Gia_MmFlex_t, 1 );
    memset( p, 0, sizeof(Gia_MmFlex_t) );

    p->nEntriesUsed  = 0;
    p->pCurrent      = NULL;
    p->pEnd          = NULL;

    p->nChunkSize    = (1 << 18);
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}